

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkleblock.cpp
# Opt level: O1

void __thiscall
CPartialMerkleTree::TraverseAndBuild
          (CPartialMerkleTree *this,int height,uint pos,
          vector<uint256,_std::allocator<uint256>_> *vTxid,
          vector<bool,_std::allocator<bool>_> *vMatch)

{
  pointer *ppuVar1;
  iterator __position;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  bool __x;
  long in_FS_OFFSET;
  uint256 local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  while( true ) {
    uVar3 = pos << ((byte)height & 0x1f);
    uVar4 = pos + 1 << ((byte)height & 0x1f);
    if (this->nTransactions <= uVar4) {
      uVar4 = this->nTransactions;
    }
    if (uVar3 < uVar4) {
      uVar2 = (ulong)uVar3;
      __x = false;
      do {
        __x = (bool)(__x | ((vMatch->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                            [uVar2 >> 6] >> (uVar2 & 0x3f) & 1) != 0);
        uVar2 = uVar2 + 1;
      } while (uVar4 != uVar2);
    }
    else {
      __x = false;
    }
    ::wallet::_GLOBAL__N_1::std::vector<bool,_std::allocator<bool>_>::push_back
              ((vector<bool,_std::allocator<bool>_> *)&this->vBits,__x);
    if ((height == 0) || (!__x)) break;
    height = height + -1;
    TraverseAndBuild(this,height,pos * 2,vTxid,vMatch);
    pos = pos * 2 + 1;
    if (~(-1 << ((byte)height & 0x1f)) + this->nTransactions >> ((byte)height & 0x1f) <= pos) {
LAB_0035d483:
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return;
    }
  }
  CalcHash(&local_58,this,height,pos,vTxid);
  __position._M_current =
       (this->vHash).super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->vHash).super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<uint256,_std::allocator<uint256>_>::_M_realloc_insert<uint256>
              (&this->vHash,__position,&local_58);
  }
  else {
    *(undefined8 *)(((__position._M_current)->super_base_blob<256U>).m_data._M_elems + 0x10) =
         local_58.super_base_blob<256U>.m_data._M_elems._16_8_;
    *(undefined8 *)(((__position._M_current)->super_base_blob<256U>).m_data._M_elems + 0x18) =
         local_58.super_base_blob<256U>.m_data._M_elems._24_8_;
    *(undefined8 *)((__position._M_current)->super_base_blob<256U>).m_data._M_elems =
         local_58.super_base_blob<256U>.m_data._M_elems._0_8_;
    *(undefined8 *)(((__position._M_current)->super_base_blob<256U>).m_data._M_elems + 8) =
         local_58.super_base_blob<256U>.m_data._M_elems._8_8_;
    ppuVar1 = &(this->vHash).super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + 1;
  }
  goto LAB_0035d483;
}

Assistant:

void CPartialMerkleTree::TraverseAndBuild(int height, unsigned int pos, const std::vector<uint256> &vTxid, const std::vector<bool> &vMatch) {
    // determine whether this node is the parent of at least one matched txid
    bool fParentOfMatch = false;
    for (unsigned int p = pos << height; p < (pos+1) << height && p < nTransactions; p++)
        fParentOfMatch |= vMatch[p];
    // store as flag bit
    vBits.push_back(fParentOfMatch);
    if (height==0 || !fParentOfMatch) {
        // if at height 0, or nothing interesting below, store hash and stop
        vHash.push_back(CalcHash(height, pos, vTxid));
    } else {
        // otherwise, don't store any hash, but descend into the subtrees
        TraverseAndBuild(height-1, pos*2, vTxid, vMatch);
        if (pos*2+1 < CalcTreeWidth(height-1))
            TraverseAndBuild(height-1, pos*2+1, vTxid, vMatch);
    }
}